

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::doAddRows(SPxLPBase<double> *this,LPRowSetBase<double> *set,bool scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  SVectorBase<double> *pSVar6;
  char *pcVar7;
  double *pdVar8;
  byte in_DL;
  int __c;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar9;
  undefined8 extraout_RDX_02;
  long *in_RSI;
  long *in_RDI;
  Real RVar10;
  DataArray<int> *colscaleExp;
  int newRowScaleExp;
  SVectorBase<double> *vec_1;
  int len;
  LPColBase<double> empty;
  SVectorBase<double> *vec;
  int oldColNumber;
  int oldRowNumber;
  DataArray<int> newCols;
  SVectorBase<double> *col;
  int idx;
  int ii;
  int k;
  int j;
  int i;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  LPColBase<double> *in_stack_fffffffffffffe68;
  double dVar11;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  LPRowSetBase<double> *in_stack_fffffffffffffea8;
  LPRowSetBase<double> *in_stack_fffffffffffffeb0;
  DataArray<int> local_48;
  SVectorBase<double> *local_30;
  uint local_28;
  int local_24;
  int local_20;
  uint local_1c;
  int local_18;
  byte local_11;
  long *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  nCols((SPxLPBase<double> *)0x234bb7);
  DataArray<int>::DataArray
            ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),(int)in_stack_fffffffffffffe68,
             (Real)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  iVar1 = nRows((SPxLPBase<double> *)0x234bdd);
  iVar2 = nCols((SPxLPBase<double> *)0x234c01);
  if (local_10 != in_RDI) {
    LPRowSetBase<double>::add(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  local_18 = nCols((SPxLPBase<double> *)0x234c69);
  while (local_18 = local_18 + -1, -1 < local_18) {
    piVar5 = DataArray<int>::operator[](&local_48,local_18);
    *piVar5 = 0;
  }
  local_18 = LPRowSetBase<double>::num((LPRowSetBase<double> *)0x234cc7);
  while (local_18 = local_18 + -1, -1 < local_18) {
    pSVar6 = LPRowSetBase<double>::rowVector
                       ((LPRowSetBase<double> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
    local_1c = SVectorBase<double>::size(pSVar6);
    uVar9 = extraout_RDX;
    while (local_1c = local_1c - 1, -1 < (int)local_1c) {
      pcVar7 = SVectorBase<double>::index(pSVar6,(char *)(ulong)local_1c,(int)uVar9);
      local_24 = (int)pcVar7;
      iVar3 = nCols((SPxLPBase<double> *)0x234d78);
      if (iVar3 <= (int)pcVar7) {
        LPColBase<double>::LPColBase
                  ((LPColBase<double> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c);
        DataArray<int>::reSize
                  ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c);
        for (local_20 = nCols((SPxLPBase<double> *)0x234dcd); local_20 <= local_24;
            local_20 = local_20 + 1) {
          piVar5 = DataArray<int>::operator[](&local_48,local_20);
          *piVar5 = 0;
          LPColSetBase<double>::add
                    ((LPColSetBase<double> *)
                     CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe68);
        }
        LPColBase<double>::~LPColBase((LPColBase<double> *)0x234e74);
      }
      piVar5 = DataArray<int>::operator[](&local_48,local_24);
      *piVar5 = *piVar5 + 1;
      uVar9 = extraout_RDX_00;
    }
  }
  local_18 = nCols((SPxLPBase<double> *)0x234eca);
  while (local_18 = local_18 + -1, -1 < local_18) {
    piVar5 = DataArray<int>::operator[](&local_48,local_18);
    if (0 < *piVar5) {
      piVar5 = DataArray<int>::operator[](&local_48,local_18);
      iVar3 = *piVar5;
      pSVar6 = colVector((SPxLPBase<double> *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe5c);
      iVar4 = SVectorBase<double>::size(pSVar6);
      LPColSetBase<double>::xtend
                ((LPColSetBase<double> *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
      pSVar6 = colVector_w((SPxLPBase<double> *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe5c);
      SVectorBase<double>::set_size(pSVar6,iVar3 + iVar4);
    }
  }
  local_18 = nRows((SPxLPBase<double> *)0x234fe4);
  while (local_18 = local_18 + -1, iVar1 <= local_18) {
    pSVar6 = rowVector_w((SPxLPBase<double> *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe5c);
    if ((local_11 & 1) != 0) {
      iVar3 = (**(code **)(*(long *)in_RDI[0x35] + 8))
                        ((long *)in_RDI[0x35],pSVar6,(DataArray<int> *)(in_RDI + 0x2f));
      pdVar8 = rhs((SPxLPBase<double> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c);
      dVar11 = *pdVar8;
      pdVar8 = (double *)infinity();
      if (dVar11 < *pdVar8) {
        rhs_w((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              in_stack_fffffffffffffe5c);
        RVar10 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe5c);
        pdVar8 = rhs_w((SPxLPBase<double> *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c);
        *pdVar8 = RVar10;
      }
      pdVar8 = lhs((SPxLPBase<double> *)
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe5c);
      dVar11 = *pdVar8;
      pdVar8 = (double *)infinity();
      if (-*pdVar8 < dVar11) {
        lhs_w((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
              in_stack_fffffffffffffe5c);
        RVar10 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe5c);
        pdVar8 = lhs_w((SPxLPBase<double> *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       in_stack_fffffffffffffe5c);
        *pdVar8 = RVar10;
      }
      maxRowObj_w((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                  ,in_stack_fffffffffffffe5c);
      RVar10 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe5c);
      pdVar8 = maxRowObj_w((SPxLPBase<double> *)
                           CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                           in_stack_fffffffffffffe5c);
      *pdVar8 = RVar10;
      piVar5 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),local_18);
      *piVar5 = iVar3;
    }
    local_1c = SVectorBase<double>::size(pSVar6);
    uVar9 = extraout_RDX_01;
    while (local_1c = local_1c - 1, -1 < (int)local_1c) {
      piVar5 = (int *)SVectorBase<double>::index(pSVar6,(char *)(ulong)local_1c,(int)uVar9);
      local_20 = *piVar5;
      local_30 = colVector_w((SPxLPBase<double> *)
                             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                             in_stack_fffffffffffffe5c);
      iVar3 = SVectorBase<double>::size(local_30);
      piVar5 = DataArray<int>::operator[](&local_48,local_20);
      local_28 = iVar3 - *piVar5;
      piVar5 = DataArray<int>::operator[](&local_48,local_20);
      iVar3 = local_18;
      *piVar5 = *piVar5 + -1;
      piVar5 = (int *)SVectorBase<double>::index(local_30,(char *)(ulong)local_28,__c);
      *piVar5 = iVar3;
      if ((local_11 & 1) != 0) {
        SVectorBase<double>::value(pSVar6,local_1c);
        DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),local_20);
        RVar10 = spxLdexp((Real)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe5c);
        pdVar8 = SVectorBase<double>::value(pSVar6,local_1c);
        *pdVar8 = RVar10;
      }
      pdVar8 = SVectorBase<double>::value(pSVar6,local_1c);
      dVar11 = *pdVar8;
      pdVar8 = SVectorBase<double>::value(local_30,local_28);
      *pdVar8 = dVar11;
      uVar9 = extraout_RDX_02;
    }
  }
  iVar3 = nRows((SPxLPBase<double> *)0x23541f);
  (**(code **)(*in_RDI + 0x280))(in_RDI,iVar3 - iVar1);
  iVar1 = nCols((SPxLPBase<double> *)0x235455);
  (**(code **)(*in_RDI + 0x288))(in_RDI,iVar1 - iVar2);
  DataArray<int>::~DataArray((DataArray<int> *)CONCAT44(iVar3,iVar1));
  return;
}

Assistant:

void doAddRows(const LPRowSetBase<R>& set, bool scale = false)
   {
      int i, j, k, ii, idx;
      SVectorBase<R>* col;
      DataArray < int > newCols(nCols());
      int oldRowNumber = nRows();
      int oldColNumber = nCols();

      if(&set != this)
         LPRowSetBase<R>::add(set);

      assert(LPRowSetBase<R>::isConsistent());
      assert(LPColSetBase<R>::isConsistent());

      // count additional nonzeros per column
      for(i = nCols() - 1; i >= 0; --i)
         newCols[i] = 0;

      for(i = set.num() - 1; i >= 0; --i)
      {
         const SVectorBase<R>& vec = set.rowVector(i);

         for(j = vec.size() - 1; j >= 0; --j)
         {
            // create new columns if required
            ii = vec.index(j);

            if(ii >= nCols())
            {
               LPColBase<R> empty;
               newCols.reSize(ii + 1);

               for(k = nCols(); k <= ii; ++k)
               {
                  newCols[k] = 0;
                  LPColSetBase<R>::add(empty);
               }
            }

            assert(ii < nCols());
            newCols[ii]++;
         }
      }

      // extend columns as required (backward because of memory efficiency reasons)
      for(i = nCols() - 1; i >= 0; --i)
      {
         if(newCols[i] > 0)
         {
            int len = newCols[i] + colVector(i).size();
            LPColSetBase<R>::xtend(i, len);

            /* preset the sizes: beware that this can irritate a consistency check call from xtend(). We need to set the
             * sizes here, because a possible garbage collection called from xtend might destroy the sizes again. */
            colVector_w(i).set_size(len);
         }
      }

      // compute new row scaling factor and insert new elements to column file
      for(i = nRows() - 1; i >= oldRowNumber; --i)
      {
         SVectorBase<R>& vec = rowVector_w(i);
         int newRowScaleExp = 0;

         DataArray <int>& colscaleExp = LPColSetBase<R>::scaleExp;

         // compute new row scaling factor and apply it to the sides
         if(scale)
         {
            newRowScaleExp = lp_scaler->computeScaleExp(vec, colscaleExp);

            if(rhs(i) < R(infinity))
               rhs_w(i) = spxLdexp(rhs_w(i), newRowScaleExp);

            if(lhs(i) > R(-infinity))
               lhs_w(i) = spxLdexp(lhs_w(i), newRowScaleExp);

            maxRowObj_w(i) = spxLdexp(maxRowObj_w(i), newRowScaleExp);

            LPRowSetBase<R>::scaleExp[i] = newRowScaleExp;
         }

         for(j = vec.size() - 1; j >= 0; --j)
         {
            k = vec.index(j);
            col = &colVector_w(k);
            idx = col->size() - newCols[k];
            assert(newCols[k] > 0);
            assert(idx >= 0);
            newCols[k]--;
            col->index(idx) = i;

            // apply new row and existing column scaling factors to both ColSet and RowSet
            if(scale)
               vec.value(j) = spxLdexp(vec.value(j), newRowScaleExp + colscaleExp[k]);

            col->value(idx) = vec.value(j);
         }
      }

#ifndef NDEBUG

      for(i = 0; i < nCols(); ++i)
         assert(newCols[i] == 0);

#endif

      assert(SPxLPBase<R>::isConsistent());

      assert(set.num() == nRows() - oldRowNumber);
      addedRows(nRows() - oldRowNumber);
      addedCols(nCols() - oldColNumber);
   }